

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::internal::
BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>,_1,_1,_false,_true>
::BlockImpl_dense(BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_1,_1,_false,_true>
                  *this,Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>
                        *xpr,Index i)

{
  long lVar1;
  XprTypeNested *pXVar2;
  byte bVar3;
  
  bVar3 = 0;
  MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>,_1,_1,_false>,_0>
  ::MapBase((MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_1,_1,_false>,_0>
             *)this,(xpr->
                    super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
                    ).
                    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_0>
                    .m_data + i,1,1);
  pXVar2 = &this->m_xpr;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pXVar2->
    super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
    ).
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_0>
    .m_data = (xpr->
              super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
              ).
              super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_0>
              .m_data;
    xpr = (Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false> *
          )((long)xpr + ((ulong)bVar3 * -2 + 1) * 8);
    pXVar2 = (XprTypeNested *)((long)pXVar2 + (ulong)bVar3 * -0x10 + 8);
  }
  (this->m_startRow).m_value = i;
  this->m_outerStride =
       (((this->m_xpr).
         super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
         .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr)->
       super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  return;
}

Assistant:

BlockImpl_dense(XprType& xpr, Index i)
      : Base(xpr.data() + i * (    ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && (!XprTypeIsRowMajor))
                                || ((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && ( XprTypeIsRowMajor)) ? xpr.innerStride() : xpr.outerStride()),
             BlockRows==1 ? 1 : xpr.rows(),
             BlockCols==1 ? 1 : xpr.cols()),
        m_xpr(xpr),
        m_startRow( (BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) ? i : 0),
        m_startCol( (BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) ? i : 0)
    {
      init();
    }